

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O1

string * booster::locale::conv::from_utf<wchar_t>
                   (string *__return_storage_ptr__,wchar_t *begin,wchar_t *end,locale *loc,
                   method_type how)

{
  info *piVar1;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  piVar1 = std::use_facet<booster::locale::info>(loc);
  (**(code **)(*(long *)piVar1 + 0x10))(local_48,piVar1,3);
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)__return_storage_ptr__,begin,(string *)end,(method_type)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string from_utf(CharType const *begin,CharType const *end,std::locale const &loc,method_type how=default_method)
            {
                return from_utf(begin,end,std::use_facet<info>(loc).encoding(),how);
            }